

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

value_type __thiscall
andres::
BinaryViewExpression<andres::View<int,true,std::allocator<unsigned_long>>,int,andres::View<int,true,std::allocator<unsigned_long>>,int,andres::marray_detail::Times<int,int,int>>
::operator()(BinaryViewExpression<andres::View<int,true,std::allocator<unsigned_long>>,int,andres::View<int,true,std::allocator<unsigned_long>>,int,andres::marray_detail::Times<int,int,int>>
             *this,int it)

{
  int iVar1;
  reference x;
  reference y;
  int it_local;
  BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
  *this_local;
  
  x = View<int,true,std::allocator<unsigned_long>>::operator()
                (*(View<int,true,std::allocator<unsigned_long>> **)this,it);
  y = View<int,true,std::allocator<unsigned_long>>::operator()
                (*(View<int,true,std::allocator<unsigned_long>> **)(this + 8),it);
  iVar1 = marray_detail::Times<int,_int,_int>::operator()((Times<int,_int,_int> *)(this + 0x10),x,y)
  ;
  return iVar1;
}

Assistant:

const value_type operator()(Accessor it) const
            { return binaryFunctor_(e1_(it), e2_(it)); }